

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O2

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  int iVar1;
  byte *__dest;
  uint uVar2;
  char *p;
  ulong uVar3;
  scoped_fixed_array<char,_8192> str;
  char *ptr [64];
  
  str._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bb18;
  __dest = (byte *)operator_new__(0x2000);
  str.size_ = 0x2000;
  str.ptr_ = (char *)__dest;
  strncpy((char *)__dest,__file,0x2000);
  ptr[0] = "open_jtalk";
  uVar2 = (uint)*__dest;
  uVar3 = 1;
  do {
    if ((char)uVar2 == '\0') {
LAB_0013cead:
      iVar1 = open(this,(char *)(uVar3 & 0xffffffff),(int)ptr,___oflag);
      scoped_fixed_array<char,_8192>::~scoped_fixed_array(&str);
      return iVar1;
    }
    while( true ) {
      iVar1 = isspace((int)(char)uVar2);
      if (iVar1 == 0) break;
      *__dest = 0;
      uVar2 = (uint)__dest[1];
      __dest = __dest + 1;
    }
    if ((char)uVar2 == '\0') goto LAB_0013cead;
    ptr[uVar3] = (char *)__dest;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x200) {
      uVar3 = 0x200;
      goto LAB_0013cead;
    }
    while ((uVar2 = (uint)(char)*__dest, *__dest != 0 && (iVar1 = isspace(uVar2), iVar1 == 0))) {
      __dest = __dest + 1;
    }
  } while( true );
}

Assistant:

bool Param::open(const char *arg, const Option *opts) {
  scoped_fixed_array<char, BUF_SIZE> str;
  std::strncpy(str.get(), arg, str.size());
  char* ptr[64];
  unsigned int size = 1;
  ptr[0] = const_cast<char*>(PACKAGE);

  for (char *p = str.get(); *p;) {
    while (isspace(*p)) *p++ = '\0';
    if (*p == '\0') break;
    ptr[size++] = p;
    if (size == sizeof(ptr)) break;
    while (*p && !isspace(*p)) p++;
  }

  return open(size, ptr, opts);
}